

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MXFTypes.h
# Opt level: O2

bool __thiscall
ASDCP::MXF::
FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
::Archive(FixedSizeItemCollection<std::vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>_>
          *this,MemIOWriter *Writer)

{
  bool bVar1;
  byte bVar2;
  uint uVar3;
  pointer pDVar4;
  pointer pDVar5;
  
  bVar1 = Kumu::MemIOWriter::WriteUi32BE
                    (Writer,(ui32_t)((ulong)((long)(this->
                                                  super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                                                  ).
                                                  super__Vector_base<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_finish -
                                            (long)(this->
                                                  super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                                                  ).
                                                  super__Vector_base<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                                                  ._M_impl.super__Vector_impl_data._M_start) >> 4));
  if (bVar1) {
    bVar1 = Kumu::MemIOWriter::WriteUi32BE(Writer,6);
    if (bVar1) {
      pDVar5 = (this->
               super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
               ).
               super__Vector_base<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
               ._M_impl.super__Vector_impl_data._M_start;
      pDVar4 = (this->
               super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
               ).
               super__Vector_base<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar3 = 1;
      bVar2 = 1;
      if (pDVar5 != pDVar4) {
        for (; (bVar2 = (byte)uVar3, (uVar3 & 1) != 0 && (pDVar5 != pDVar4)); pDVar5 = pDVar5 + 1) {
          uVar3 = (*(pDVar5->super_IArchive)._vptr_IArchive[4])(pDVar5,Writer);
          pDVar4 = (this->
                   super_vector<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                   ).
                   super__Vector_base<ASDCP::MXF::IndexTableSegment::DeltaEntry,_std::allocator<ASDCP::MXF::IndexTableSegment::DeltaEntry>_>
                   ._M_impl.super__Vector_impl_data._M_finish;
        }
      }
      goto LAB_001a1780;
    }
  }
  bVar2 = 0;
LAB_001a1780:
  return (bool)(bVar2 & 1);
}

Assistant:

bool Archive(Kumu::MemIOWriter* Writer) const {
	    if ( ! Writer->WriteUi32BE((ui32_t)this->size()) ) return false;
	    if ( ! Writer->WriteUi32BE((ui32_t)this->ItemSize()) ) return false;
	    if ( this->empty() ) return true;
	    
	    typename ContainerType::const_iterator i;
	    bool result = true;
	    for ( i = this->begin(); i != this->end() && result; ++i )
	      {
		result = i->Archive(Writer);
	      }

	    return result;
	  }